

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int loadMem(char *filename,char **mem,int *size)

{
  int iVar1;
  char *__ptr;
  ssize_t sVar2;
  int local_cc;
  int siz;
  char *base;
  stat info;
  int res;
  int fd;
  int *size_local;
  char **mem_local;
  char *filename_local;
  
  local_cc = 0;
  iVar1 = stat64(filename,(stat64 *)&base);
  if (iVar1 < 0) {
    filename_local._4_4_ = -1;
  }
  else {
    __ptr = (char *)malloc(info.st_rdev + 1);
    if (__ptr == (char *)0x0) {
      filename_local._4_4_ = -1;
    }
    else {
      info.__glibc_reserved[2]._4_4_ = open64(filename,0);
      if (info.__glibc_reserved[2]._4_4_ < 0) {
        free(__ptr);
        filename_local._4_4_ = -1;
      }
      else {
        while( true ) {
          sVar2 = read(info.__glibc_reserved[2]._4_4_,__ptr + local_cc,info.st_rdev - (long)local_cc
                      );
          info.__glibc_reserved[2]._0_4_ = (int)sVar2;
          if ((int)info.__glibc_reserved[2] < 1) break;
          local_cc = (int)info.__glibc_reserved[2] + local_cc;
        }
        close(info.__glibc_reserved[2]._4_4_);
        if ((long)local_cc == info.st_rdev) {
          __ptr[local_cc] = '\0';
          *mem = __ptr;
          *size = local_cc;
          filename_local._4_4_ = 0;
        }
        else {
          free(__ptr);
          filename_local._4_4_ = -1;
        }
      }
    }
  }
  return filename_local._4_4_;
}

Assistant:

static int loadMem(const char *filename, const char **mem, int *size) {
    int fd, res;
    struct stat info;
    char *base;
    int siz = 0;
    if (stat(filename, &info) < 0)
	return(-1);
    base = malloc(info.st_size + 1);
    if (base == NULL)
	return(-1);
    if ((fd = open(filename, RD_FLAGS)) < 0) {
        free(base);
	return(-1);
    }
    while ((res = read(fd, &base[siz], info.st_size - siz)) > 0) {
        siz += res;
    }
    close(fd);
#if !defined(_WIN32)
    if (siz != info.st_size) {
        free(base);
	return(-1);
    }
#endif
    base[siz] = 0;
    *mem = base;
    *size = siz;
    return(0);
}